

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralBlockPanelKernel.h
# Opt level: O0

void __thiscall
Eigen::internal::
gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
::operator()(gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
             *this,double *blockA,const_blas_data_mapper<double,_long,_0> *lhs,long depth,long rows,
            long stride,long offset)

{
  bool bVar1;
  double (*padVar2) [2];
  double *pdVar3;
  Packet2d adVar4;
  long local_180;
  long k_2;
  Packet A_1;
  long local_160;
  long k_1;
  Packet B;
  Packet A;
  long k;
  long i;
  long peeled_mc0;
  long peeled_mc1;
  long peeled_mc2;
  long peeled_mc3;
  long count;
  long lStack_f8;
  conj_if<false> cj;
  long stride_local;
  long rows_local;
  long depth_local;
  const_blas_data_mapper<double,_long,_0> *lhs_local;
  double *blockA_local;
  gemm_pack_lhs<double,_long,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_4,_2,_0,_false,_false>
  *this_local;
  
  lStack_f8 = stride;
  ignore_unused_variable<long>(&stack0xffffffffffffff08);
  ignore_unused_variable<long>(&offset);
  if ((lStack_f8 != 0) || (bVar1 = true, offset != 0)) {
    bVar1 = false;
  }
  if (bVar1) {
    peeled_mc3 = 0;
    for (k = 0; k < rows / 4 << 2; k = k + 4) {
      for (A[1] = 0.0; (long)A[1] < depth; A[1] = (double)((long)A[1] + 1)) {
        adVar4 = ploadu<double__vector(2)>
                           ((lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                            k + (long)A[1] *
                                (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride);
        B[1] = adVar4[0];
        adVar4 = ploadu<double__vector(2)>
                           ((lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                            k + 2 + (long)A[1] *
                                    (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride
                           );
        k_1 = adVar4[0];
        padVar2 = conj_if<false>::pconj<double__vector(2)>
                            ((conj_if<false> *)((long)&count + 7),(double (*) [2])(B + 1));
        pstore<double,double__vector(2)>(blockA + peeled_mc3,padVar2);
        padVar2 = conj_if<false>::pconj<double__vector(2)>
                            ((conj_if<false> *)((long)&count + 7),(double (*) [2])&k_1);
        pstore<double,double__vector(2)>(blockA + peeled_mc3 + 2,padVar2);
        peeled_mc3 = peeled_mc3 + 4;
      }
    }
    for (; k < rows / 2 << 1; k = k + 2) {
      for (local_160 = 0; local_160 < depth; local_160 = local_160 + 1) {
        adVar4 = ploadu<double__vector(2)>
                           ((lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                            k + local_160 *
                                (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride);
        k_2 = adVar4[0];
        padVar2 = conj_if<false>::pconj<double__vector(2)>
                            ((conj_if<false> *)((long)&count + 7),(double (*) [2])&k_2);
        pstore<double,double__vector(2)>(blockA + peeled_mc3,padVar2);
        peeled_mc3 = peeled_mc3 + 2;
      }
    }
    for (; k < rows; k = k + 1) {
      for (local_180 = 0; local_180 < depth; local_180 = local_180 + 1) {
        pdVar3 = conj_if<false>::operator()
                           ((conj_if<false> *)((long)&count + 7),
                            (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_data +
                            k + local_180 *
                                (lhs->super_blas_data_mapper<const_double,_long,_0,_0>).m_stride);
        blockA[peeled_mc3] = *pdVar3;
        peeled_mc3 = peeled_mc3 + 1;
      }
    }
    return;
  }
  __assert_fail("((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jin-qin[P]cppcnn/src/cppcnn/../../3rdparty/Eigen/src/Core/products/GeneralBlockPanelKernel.h"
                ,0x6b0,
                "void Eigen::internal::gemm_pack_lhs<double, long, Eigen::internal::const_blas_data_mapper<double, long, 0>, 4, 2, 0>::operator()(Scalar *, const DataMapper &, Index, Index, Index, Index) [Scalar = double, Index = long, DataMapper = Eigen::internal::const_blas_data_mapper<double, long, 0>, Pack1 = 4, Pack2 = 2, StorageOrder = 0, Conjugate = false, PanelMode = false]"
               );
}

Assistant:

EIGEN_DONT_INLINE void gemm_pack_lhs<Scalar, Index, DataMapper, Pack1, Pack2, ColMajor, Conjugate, PanelMode>
  ::operator()(Scalar* blockA, const DataMapper& lhs, Index depth, Index rows, Index stride, Index offset)
{
  typedef typename packet_traits<Scalar>::type Packet;
  enum { PacketSize = packet_traits<Scalar>::size };

  EIGEN_ASM_COMMENT("EIGEN PRODUCT PACK LHS");
  EIGEN_UNUSED_VARIABLE(stride);
  EIGEN_UNUSED_VARIABLE(offset);
  eigen_assert(((!PanelMode) && stride==0 && offset==0) || (PanelMode && stride>=depth && offset<=stride));
  eigen_assert( ((Pack1%PacketSize)==0 && Pack1<=4*PacketSize) || (Pack1<=4) );
  conj_if<NumTraits<Scalar>::IsComplex && Conjugate> cj;
  Index count = 0;

  const Index peeled_mc3 = Pack1>=3*PacketSize ? (rows/(3*PacketSize))*(3*PacketSize) : 0;
  const Index peeled_mc2 = Pack1>=2*PacketSize ? peeled_mc3+((rows-peeled_mc3)/(2*PacketSize))*(2*PacketSize) : 0;
  const Index peeled_mc1 = Pack1>=1*PacketSize ? (rows/(1*PacketSize))*(1*PacketSize) : 0;
  const Index peeled_mc0 = Pack2>=1*PacketSize ? peeled_mc1
                         : Pack2>1             ? (rows/Pack2)*Pack2 : 0;

  Index i=0;

  // Pack 3 packets
  if(Pack1>=3*PacketSize)
  {
    for(; i<peeled_mc3; i+=3*PacketSize)
    {
      if(PanelMode) count += (3*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B, C;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        C = lhs.loadPacket(i+2*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(C)); count+=PacketSize;
      }
      if(PanelMode) count += (3*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 2 packets
  if(Pack1>=2*PacketSize)
  {
    for(; i<peeled_mc2; i+=2*PacketSize)
    {
      if(PanelMode) count += (2*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A, B;
        A = lhs.loadPacket(i+0*PacketSize, k);
        B = lhs.loadPacket(i+1*PacketSize, k);
        pstore(blockA+count, cj.pconj(A)); count+=PacketSize;
        pstore(blockA+count, cj.pconj(B)); count+=PacketSize;
      }
      if(PanelMode) count += (2*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack 1 packets
  if(Pack1>=1*PacketSize)
  {
    for(; i<peeled_mc1; i+=1*PacketSize)
    {
      if(PanelMode) count += (1*PacketSize) * offset;

      for(Index k=0; k<depth; k++)
      {
        Packet A;
        A = lhs.loadPacket(i+0*PacketSize, k);
        pstore(blockA+count, cj.pconj(A));
        count+=PacketSize;
      }
      if(PanelMode) count += (1*PacketSize) * (stride-offset-depth);
    }
  }
  // Pack scalars
  if(Pack2<PacketSize && Pack2>1)
  {
    for(; i<peeled_mc0; i+=Pack2)
    {
      if(PanelMode) count += Pack2 * offset;

      for(Index k=0; k<depth; k++)
        for(Index w=0; w<Pack2; w++)
          blockA[count++] = cj(lhs(i+w, k));

      if(PanelMode) count += Pack2 * (stride-offset-depth);
    }
  }
  for(; i<rows; i++)
  {
    if(PanelMode) count += offset;
    for(Index k=0; k<depth; k++)
      blockA[count++] = cj(lhs(i, k));
    if(PanelMode) count += (stride-offset-depth);
  }
}